

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O3

void google::protobuf::compiler::objectivec::EmitCommentsString<google::protobuf::FieldDescriptor>
               (Printer *printer,GenerationOptions *opts,FieldDescriptor *descriptor,
               CommentStringFlags flags)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  SourceLocation location;
  SourceLocation local_90;
  
  paVar1 = &local_90.leading_comments.field_2;
  local_90.leading_comments._M_string_length = 0;
  local_90.leading_comments.field_2._M_local_buf[0] = '\0';
  paVar2 = &local_90.trailing_comments.field_2;
  local_90.trailing_comments._M_string_length = 0;
  local_90.trailing_comments.field_2._M_local_buf[0] = '\0';
  local_90.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_90.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_90.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_90.leading_comments._M_dataplus._M_p = (pointer)paVar1;
  local_90.trailing_comments._M_dataplus._M_p = (pointer)paVar2;
  bVar3 = FieldDescriptor::GetSourceLocation(descriptor,&local_90);
  if (bVar3) {
    EmitCommentsString(printer,opts,&local_90,flags);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_90.leading_detached_comments);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.trailing_comments._M_dataplus._M_p != paVar2) {
    operator_delete(local_90.trailing_comments._M_dataplus._M_p,
                    CONCAT71(local_90.trailing_comments.field_2._M_allocated_capacity._1_7_,
                             local_90.trailing_comments.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.leading_comments._M_dataplus._M_p != paVar1) {
    operator_delete(local_90.leading_comments._M_dataplus._M_p,
                    CONCAT71(local_90.leading_comments.field_2._M_allocated_capacity._1_7_,
                             local_90.leading_comments.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void EmitCommentsString(io::Printer* printer, const GenerationOptions& opts,
                        const TDescriptor* descriptor,
                        CommentStringFlags flags = kCommentStringFlags_None) {
  SourceLocation location;
  if (descriptor->GetSourceLocation(&location)) {
    EmitCommentsString(printer, opts, location, flags);
  }
}